

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O3

bool woff2::NormalizeOffsets(Font *font)

{
  ushort uVar1;
  uint uVar2;
  mapped_type *pmVar3;
  uint uVar4;
  pointer puVar5;
  uint32_t uVar6;
  uint tag;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  uVar1 = font->num_tables;
  Font::OutputOrderedTags(&local_40,font);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (uint)uVar1 << 4 | 0xc;
    puVar5 = local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_44 = *puVar5;
      pmVar3 = std::
               map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
               ::operator[](&font->tables,&local_44);
      pmVar3->offset = uVar6;
      uVar2 = pmVar3->length;
      uVar4 = uVar2 + 3 & 0xfffffffc;
      if (0xfffffffc < uVar2) {
        uVar4 = uVar2;
      }
      uVar6 = uVar6 + uVar4;
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool NormalizeOffsets(Font* font) {
  uint32_t offset = 12 + 16 * font->num_tables;
  for (auto tag : font->OutputOrderedTags()) {
    auto& table = font->tables[tag];
    table.offset = offset;
    offset += Round4(table.length);
  }
  return true;
}